

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O0

_Bool isNaN(char **endptr)

{
  int iVar1;
  char *nptr;
  bool bVar2;
  _Bool _Var3;
  char *pcStack_18;
  _Bool result;
  char *runner;
  char **endptr_local;
  
  nptr = *endptr;
  _Var3 = false;
  iVar1 = substricmp(nptr,"NAN");
  if (iVar1 == 0) {
    nptr = nptr + 3;
    _Var3 = true;
    if (*nptr == '(') {
      do {
        pcStack_18 = nptr;
        nptr = pcStack_18 + 1;
        bVar2 = false;
        if (*nptr != '\0') {
          bVar2 = *nptr != ')';
        }
      } while (bVar2);
      _Var3 = *nptr == ')';
      if (_Var3) {
        nptr = pcStack_18 + 2;
      }
    }
  }
  pcStack_18 = nptr;
  if (_Var3 != false) {
    *endptr = pcStack_18;
  }
  return _Var3;
}

Assistant:

static bool isNaN(const char** endptr)
{
    const char* runner = (*endptr);
    bool result = false;
    if (substricmp(runner, "NAN") == 0)
    {
        runner += 3;
        result = true;
        if ((*runner) == '(')
        {
            do
            {
                runner++;
            } while (((*runner) != '\0') && ((*runner) != ')'));
            if ((*runner) == ')')
                runner++;
            else
                result = false;
        }
    }
    if (result)
        (*endptr) = runner;
    return result;
}